

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_14::BinaryReaderObjdump::HandleInitExpr(BinaryReaderObjdump *this,InitExpr *expr)

{
  InitExprType IVar1;
  uint64_t uVar2;
  undefined4 uVar3;
  Enum in_EAX;
  Enum extraout_EAX;
  
  if (this->in_data_section_ == true) {
    *(undefined8 *)((long)&(this->data_init_expr_).value + 8) =
         *(undefined8 *)((long)&expr->value + 8);
    uVar3 = *(undefined4 *)&expr->field_0x4;
    uVar2 = (expr->value).i64;
    (this->data_init_expr_).type = expr->type;
    *(undefined4 *)&(this->data_init_expr_).field_0x4 = uVar3;
    (this->data_init_expr_).value.i64 = uVar2;
    IVar1 = expr->type;
    if (IVar1 < 8) {
      if (IVar1 == I32) {
        this->data_offset_ = (expr->value).index;
      }
      else if (IVar1 == Global) {
        this->data_offset_ = 0;
      }
      else {
        _GLOBAL__N_1::BinaryReaderObjdump::HandleInitExpr();
      }
    }
  }
  else {
    if (this->in_elem_section_ != true) {
      PrintInitExpr(this,expr);
      return (Result)extraout_EAX;
    }
    *(undefined8 *)((long)&(this->elem_init_expr_).value + 8) =
         *(undefined8 *)((long)&expr->value + 8);
    uVar3 = *(undefined4 *)&expr->field_0x4;
    uVar2 = (expr->value).i64;
    (this->elem_init_expr_).type = expr->type;
    *(undefined4 *)&(this->elem_init_expr_).field_0x4 = uVar3;
    (this->elem_init_expr_).value.i64 = uVar2;
    IVar1 = expr->type;
    if (IVar1 < 8) {
      if (IVar1 == I32) {
        this->elem_offset_ = (expr->value).index;
      }
      else if (IVar1 == Global) {
        this->elem_offset_ = 0;
      }
      else {
        _GLOBAL__N_1::BinaryReaderObjdump::HandleInitExpr();
      }
    }
  }
  return (Result)in_EAX;
}

Assistant:

Result BinaryReaderObjdump::HandleInitExpr(const InitExpr& expr) {
  if (in_data_section_) {
    data_init_expr_ = expr;
    return InitExprToConstOffset(expr, &data_offset_);
  } else if (in_elem_section_) {
    elem_init_expr_ = expr;
    return InitExprToConstOffset(expr, &elem_offset_);
  } else {
    PrintInitExpr(expr);
  }
  return Result::Ok;
}